

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::PositionalReferenceExpression::Deserialize
          (PositionalReferenceExpression *this,Deserializer *deserializer)

{
  tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  this_00;
  pointer pPVar1;
  __uniq_ptr_impl<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
        )operator_new(0x40);
  PositionalReferenceExpression
            ((PositionalReferenceExpression *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
             .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl =
       (tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
        )(tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
           .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl;
  pPVar1 = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator->((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,200,"index",&pPVar1->index);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
       .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> PositionalReferenceExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<PositionalReferenceExpression>(new PositionalReferenceExpression());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "index", result->index);
	return std::move(result);
}